

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

int __thiscall
soplex::
SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeaveX(SPxSteepPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *tol)

{
  uint *puVar1;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar2;
  pointer pnVar3;
  pointer pnVar4;
  type_conflict5 tVar5;
  double *pdVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_R8;
  uint uVar7;
  uint uVar8;
  int local_1ac;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  steeppr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar2 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar3 = (pSVar2->coWeights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar4 = (pSVar2->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pdVar6 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_128,-*pdVar6,(type *)0x0);
  uVar7 = (((this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver)->thecovectors->set).thenum;
  local_1ac = -1;
  uVar8 = uVar7;
  do {
    while( true ) {
      uVar7 = uVar7 - 1;
      if ((int)uVar8 < 1) {
        return local_1ac;
      }
      local_1a8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((long)&pnVar4[uVar7].m_backend.data + 0x20);
      local_1a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar4[uVar7].m_backend.data;
      local_1a8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((long)&pnVar4[uVar7].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar4[uVar7].m_backend.data + 0x10);
      local_1a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_1a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_1a8.m_backend.exp = pnVar4[uVar7].m_backend.exp;
      local_1a8.m_backend.neg = pnVar4[uVar7].m_backend.neg;
      local_1a8.m_backend.fpclass = pnVar4[uVar7].m_backend.fpclass;
      local_1a8.m_backend.prec_elem = pnVar4[uVar7].m_backend.prec_elem;
      result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
      result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
      result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
      result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
      result.m_backend.exp = (tol->m_backend).exp;
      result.m_backend.neg = (tol->m_backend).neg;
      result.m_backend.fpclass = (tol->m_backend).fpclass;
      result.m_backend.prec_elem = (tol->m_backend).prec_elem;
      if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0
         ) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      tVar5 = boost::multiprecision::operator<(&local_1a8,&result);
      if (tVar5) break;
LAB_00269ad9:
      uVar8 = uVar8 - 1;
    }
    local_68 = (steeppr  [8])local_1a8.m_backend.data._M_elems._0_8_;
    auStack_60[0] = local_1a8.m_backend.data._M_elems[2];
    auStack_60[1] = local_1a8.m_backend.data._M_elems[3];
    local_58[0] = local_1a8.m_backend.data._M_elems[4];
    local_58[1] = local_1a8.m_backend.data._M_elems[5];
    auStack_50[0] = local_1a8.m_backend.data._M_elems[6];
    auStack_50[1] = local_1a8.m_backend.data._M_elems[7];
    local_48[0] = local_1a8.m_backend.data._M_elems[8];
    local_48[1] = local_1a8.m_backend.data._M_elems[9];
    local_40 = local_1a8.m_backend.exp;
    local_3c = local_1a8.m_backend.neg;
    local_38 = local_1a8.m_backend.fpclass;
    iStack_34 = local_1a8.m_backend.prec_elem;
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[uVar7].m_backend.data;
    local_a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((long)&pnVar3[uVar7].m_backend.data + 8);
    puVar1 = (uint *)((long)&pnVar3[uVar7].m_backend.data + 0x10);
    local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    local_a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((long)&pnVar3[uVar7].m_backend.data + 0x20);
    local_a8.m_backend.exp = pnVar3[uVar7].m_backend.exp;
    local_a8.m_backend.neg = pnVar3[uVar7].m_backend.neg;
    local_a8.m_backend.fpclass = pnVar3[uVar7].m_backend.fpclass;
    local_a8.m_backend.prec_elem = pnVar3[uVar7].m_backend.prec_elem;
    local_e8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(tol->m_backend).data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((tol->m_backend).data._M_elems + 6);
    local_e8.m_backend.exp = (tol->m_backend).exp;
    local_e8.m_backend.neg = (tol->m_backend).neg;
    local_e8.m_backend.fpclass = (tol->m_backend).fpclass;
    local_e8.m_backend.prec_elem = (tol->m_backend).prec_elem;
    steeppr::
    computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&result,local_68,&local_a8,&local_e8,in_R8);
    local_1a8.m_backend.data._M_elems[8] = result.m_backend.data._M_elems[8];
    local_1a8.m_backend.data._M_elems[9] = result.m_backend.data._M_elems[9];
    local_1a8.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
    local_1a8.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
    local_1a8.m_backend.data._M_elems[6] = result.m_backend.data._M_elems[6];
    local_1a8.m_backend.data._M_elems[7] = result.m_backend.data._M_elems[7];
    local_1a8.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
    local_1a8.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
    local_1a8.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
    local_1a8.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
    local_1a8.m_backend.exp = result.m_backend.exp;
    local_1a8.m_backend.neg = result.m_backend.neg;
    local_1a8.m_backend.fpclass = result.m_backend.fpclass;
    local_1a8.m_backend.prec_elem = result.m_backend.prec_elem;
    tVar5 = boost::multiprecision::operator>
                      (&local_1a8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_128);
    if (!tVar5) goto LAB_00269ad9;
    local_1ac = uVar8 - 1;
    local_128.data._M_elems[8] = local_1a8.m_backend.data._M_elems[8];
    local_128.data._M_elems[9] = local_1a8.m_backend.data._M_elems[9];
    local_128.data._M_elems[0] = local_1a8.m_backend.data._M_elems[0];
    local_128.data._M_elems[1] = local_1a8.m_backend.data._M_elems[1];
    local_128.data._M_elems[2] = local_1a8.m_backend.data._M_elems[2];
    local_128.data._M_elems[3] = local_1a8.m_backend.data._M_elems[3];
    local_128.data._M_elems[4] = local_1a8.m_backend.data._M_elems[4];
    local_128.data._M_elems[5] = local_1a8.m_backend.data._M_elems[5];
    local_128.data._M_elems[6] = local_1a8.m_backend.data._M_elems[6];
    local_128.data._M_elems[7] = local_1a8.m_backend.data._M_elems[7];
    local_128.exp = local_1a8.m_backend.exp;
    local_128.neg = local_1a8.m_backend.neg;
    local_128.fpclass = local_1a8.m_backend.fpclass;
    local_128.prec_elem = local_1a8.m_backend.prec_elem;
    uVar8 = uVar7;
  } while( true );
}

Assistant:

int SPxSteepPR<R>::selectLeaveX(R tol)
{
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   const R* fTest         = this->thesolver->fTest().get_const_ptr();
   R best = R(-infinity);
   R x;
   int lastIdx = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = fTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            lastIdx = i;
         }
      }
   }

   return lastIdx;
}